

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnGenericCustomSection
          (BinaryReaderIR *this,string_view name,void *data,Offset size)

{
  string_view name_00;
  uchar *__dest;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  size_t local_c0;
  char *local_b8;
  Location local_b0;
  undefined1 local_90 [8];
  Custom custom;
  Offset size_local;
  void *data_local;
  BinaryReaderIR *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  custom.loc.field_1._8_8_ = size;
  GetLocation(&local_b0,this);
  local_b8 = (char *)name_local._M_len;
  local_c0 = name._M_len;
  memset(&local_d8,0,0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_d8);
  name_00._M_str = local_b8;
  name_00._M_len = local_c0;
  Custom::Custom((Custom *)local_90,&local_b0,name_00,&local_d8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_d8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             ((long)&custom.name.field_2 + 8),custom.loc.field_1._8_8_);
  if (custom.loc.field_1._8_8_ != 0) {
    __dest = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        ((long)&custom.name.field_2 + 8));
    memcpy(__dest,data,custom.loc.field_1._8_8_);
  }
  std::vector<wabt::Custom,_std::allocator<wabt::Custom>_>::push_back
            (&this->module_->customs,(value_type *)local_90);
  Result::Result((Result *)((long)&name_local._M_str + 4),Ok);
  Custom::~Custom((Custom *)local_90);
  return (Result)name_local._M_str._4_4_;
}

Assistant:

Result BinaryReaderIR::OnGenericCustomSection(std::string_view name,
                                              const void* data,
                                              Offset size) {
  Custom custom = Custom(GetLocation(), name);
  custom.data.resize(size);
  if (size > 0) {
    memcpy(custom.data.data(), data, size);
  }
  module_->customs.push_back(std::move(custom));
  return Result::Ok;
}